

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBar.cpp
# Opt level: O1

void __thiscall chrono::fea::ChElementBar::ChElementBar(ChElementBar *this)

{
  undefined1 auVar1 [16];
  
  (this->super_ChElementGeneric).Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_00b62688;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase =
       (_func_int **)&PTR__ChElementBar_00b5bb58;
  auVar1 = ZEXT416(0) << 0x40;
  (this->nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar1._0_8_;
  (this->nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar1._8_8_;
  (this->nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->area = 0.0001;
  this->density = 1000.0;
  this->E = 10000000.0;
  this->rdamping = 0.01;
  this->mass = (double)auVar1._0_8_;
  this->length = (double)auVar1._8_8_;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ::resize(&this->nodes,2);
  return;
}

Assistant:

ChElementBar::ChElementBar() : area(0.01 * 0.01), density(1000), E(0.01e9), rdamping(0.01), mass(0), length(0) {
    nodes.resize(2);
}